

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

QString * __thiscall
QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t>::convertTo<QString>
          (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  DataPointer *this_00;
  QString *in_RDI;
  long in_FS_OFFSET;
  iterator start;
  qsizetype len;
  QString *s;
  iterator d;
  QChar **in_stack_ffffffffffffff88;
  type *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isNull(in_stack_ffffffffffffff90);
  if (bVar2) {
    QString::QString((QString *)0x140d3c);
  }
  else {
    qVar3 = QConcatenable<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t>_>::size
                      (in_stack_ffffffffffffff90);
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(in_RDI,qVar3,Uninitialized);
    this_00 = QString::data_ptr(in_RDI);
    QArrayDataPointer<char16_t>::data(this_00);
    QConcatenable<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t>_>::
    appendTo<QChar>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }